

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_uu.c
# Opt level: O1

ssize_t uudecode_filter_read(archive_read_filter *self,void **buff)

{
  byte bVar1;
  uudecode *puVar2;
  int iVar3;
  int iVar4;
  byte *b;
  long lVar5;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  byte *pbVar9;
  byte *pbVar10;
  byte *pbVar11;
  char *pcVar12;
  uint uVar13;
  archive_read *a;
  size_t unaff_R13;
  size_t sVar14;
  size_t sVar15;
  long lVar16;
  bool bVar17;
  ssize_t avail_in;
  ssize_t nl;
  long local_78;
  byte *local_68;
  size_t local_60;
  uudecode *local_58;
  size_t local_50;
  size_t local_48;
  void **local_40;
  long local_38;
  
  puVar2 = (uudecode *)self->data;
  b = (byte *)__archive_read_filter_ahead(self->upstream,1,(ssize_t *)&local_60);
  bVar17 = b == (byte *)0x0;
  local_58 = puVar2;
  local_40 = buff;
  if ((bVar17) && ((long)local_60 < 0)) {
    return -0x1e;
  }
LAB_001166a3:
  puVar2 = local_58;
  if (bVar17) {
    local_60 = 0;
  }
  local_50 = local_60;
  sVar15 = local_60;
  if (local_58->state != 4) {
    local_68 = local_58->out_buff;
    lVar5 = local_58->in_cnt;
    if (lVar5 != 0) {
      if (0x8800 < lVar5) {
        archive_set_error(&self->archive->archive,0x54,"Invalid format data");
        return -0x1e;
      }
      iVar3 = ensure_in_buff_size(self,local_58,lVar5 + local_60);
      if (iVar3 != 0) {
        return -0x1e;
      }
      memcpy(puVar2->in_buff + puVar2->in_cnt,b,local_60);
      b = puVar2->in_buff;
      local_60 = local_60 + puVar2->in_cnt;
      puVar2->in_cnt = 0;
    }
    if (0 < (long)local_60) {
      local_78 = 0;
      sVar15 = 0;
      sVar14 = unaff_R13;
      do {
        sVar8 = local_60;
        unaff_R13 = get_line(b,local_60 - sVar15,&local_38);
        puVar2 = local_58;
        if ((long)unaff_R13 < 0) {
          unaff_R13 = sVar14;
          if ((local_58->state == 0) && ((0 < local_58->total || (0 < local_78)))) {
            local_58->state = 4;
            iVar3 = 3;
            sVar15 = sVar8;
          }
          else {
            archive_set_error(&self->archive->archive,-1,"Insufficient compressed data");
            iVar3 = 1;
          }
          goto LAB_00116d6e;
        }
        if ((local_38 == 0) && (local_58->state != 2)) {
          if (local_78 == 0 && (long)local_50 < 1) {
            archive_set_error(&self->archive->archive,0x54,"Missing format data");
            iVar3 = 1;
LAB_00116a32:
            local_78 = 0;
          }
          else {
            iVar4 = ensure_in_buff_size(self,local_58,unaff_R13);
            iVar3 = 1;
            if (iVar4 == 0) {
              if (puVar2->in_buff != b) {
                memmove(puVar2->in_buff,b,unaff_R13);
              }
              puVar2->in_cnt = unaff_R13;
              if (local_78 == 0) {
                __archive_read_filter_consume(self->upstream,local_50);
                iVar3 = 2;
                goto LAB_00116a32;
              }
              sVar15 = unaff_R13 + sVar15;
              iVar3 = 4;
            }
          }
        }
        else {
          iVar3 = local_58->state;
          if (iVar3 == 1) {
            iVar3 = 3;
            if (0x10000 < (long)(local_78 + unaff_R13 * 2)) goto LAB_00116d6e;
            if ((""[*b] != '\0') && (0 < (long)(unaff_R13 - local_38))) {
              uVar13 = *b & 0x3f;
              uVar7 = (ulong)uVar13 ^ 0x20;
              if ((long)uVar7 < (long)(unaff_R13 - local_38)) {
                if ((char)uVar13 == ' ') {
                  local_58->state = 2;
                }
                else {
                  pbVar11 = b + 1;
                  lVar5 = local_78;
                  do {
                    local_78 = lVar5;
                    if ((long)uVar7 < 1) {
                      uVar7 = 0;
                      break;
                    }
                    if ((""[*pbVar11] == '\0') || (""[pbVar11[1]] == '\0')) {
                      bVar17 = false;
                    }
                    else {
                      pbVar9 = pbVar11 + 2;
                      uVar13 = (pbVar11[1] & 0x3f ^ 0x20) << 0xc | (*pbVar11 ^ 0x20) << 0x12;
                      pbVar10 = local_68 + 1;
                      *local_68 = (byte)(uVar13 >> 0x10);
                      local_78 = lVar5 + 1;
                      if (uVar7 == 1) {
                        uVar7 = 0;
                        pbVar11 = pbVar9;
LAB_00116ce6:
                        bVar17 = true;
                        if ((long)uVar7 < 1) {
                          uVar7 = 0;
                          local_68 = pbVar10;
                          bVar17 = true;
                        }
                        else {
                          bVar1 = *pbVar11;
                          if (""[bVar1] == '\0') goto LAB_00116d24;
                          pbVar11 = pbVar11 + 1;
                          *pbVar10 = (byte)uVar13 | bVar1 & 0x3f ^ 0x20;
                          local_78 = local_78 + 1;
                          uVar7 = uVar7 - 1;
                          local_68 = pbVar10 + 1;
                        }
                      }
                      else {
                        if (""[*pbVar9] != '\0') {
                          uVar13 = (*pbVar9 & 0x3f ^ 0x20) << 6 | uVar13;
                          local_68[1] = (byte)(uVar13 >> 8);
                          pbVar10 = local_68 + 2;
                          local_78 = lVar5 + 2;
                          uVar7 = uVar7 - 2;
                          pbVar11 = pbVar11 + 3;
                          goto LAB_00116ce6;
                        }
                        uVar7 = uVar7 - 1;
                        pbVar11 = pbVar9;
LAB_00116d24:
                        bVar17 = false;
                        local_68 = pbVar10;
                      }
                    }
                    lVar5 = local_78;
                  } while (bVar17);
                  if (uVar7 != 0) goto LAB_00116d47;
                }
LAB_00116d8b:
                iVar3 = 0;
                goto LAB_00116d6e;
              }
            }
LAB_00116d47:
            a = self->archive;
            iVar3 = -1;
            pcVar12 = "Insufficient compressed data";
LAB_00116d5c:
            archive_set_error(&a->archive,iVar3,pcVar12);
            iVar3 = 1;
          }
          else {
            if (iVar3 == 2) {
              if ((unaff_R13 - local_38 == 3) && (b[2] == 100 && *(short *)b == 0x6e65)) {
LAB_00116959:
                local_58->state = 0;
                goto LAB_00116d8b;
              }
              goto LAB_00116d47;
            }
            if (iVar3 == 3) {
              iVar3 = 3;
              if ((long)(local_78 + unaff_R13 * 2) < 0x10001) {
                lVar5 = unaff_R13 - local_38;
                pbVar11 = b;
                if ((((2 < lVar5) && (*b == 0x3d)) && (b[1] == 0x3d)) && (b[2] == 0x3d))
                goto LAB_00116959;
                do {
                  lVar6 = lVar5;
                  pbVar9 = pbVar11;
                  lVar16 = local_78;
                  if (lVar5 < 1) break;
                  if ((""[*pbVar11] == '\0') || (""[pbVar11[1]] == '\0')) {
LAB_001168c1:
                    bVar17 = false;
                  }
                  else {
                    pbVar9 = pbVar11 + 2;
                    uVar13 = base64num[pbVar11[1]] << 0xc | base64num[*pbVar11] << 0x12;
                    *local_68 = (byte)(uVar13 >> 0x10);
                    lVar16 = local_78 + 1;
                    lVar6 = lVar5 + -2;
                    pbVar10 = local_68 + 1;
                    if (lVar5 < 3) {
LAB_0011688c:
                      local_68 = pbVar10;
                      bVar17 = true;
                      if (0 < lVar6) {
                        uVar7 = (ulong)*pbVar9;
                        if ((uVar7 == 0x3d) || (""[uVar7] == '\0')) goto LAB_001168c1;
                        pbVar9 = pbVar9 + 1;
                        *local_68 = (byte)uVar13 | (byte)base64num[uVar7];
                        lVar16 = lVar16 + 1;
                        lVar6 = lVar6 + -1;
                        local_68 = local_68 + 1;
                      }
                    }
                    else {
                      uVar7 = (ulong)*pbVar9;
                      if ((uVar7 != 0x3d) && (""[uVar7] != '\0')) {
                        pbVar9 = pbVar11 + 3;
                        uVar13 = uVar13 | base64num[uVar7] << 6;
                        local_68[1] = (byte)(uVar13 >> 8);
                        lVar16 = local_78 + 2;
                        lVar6 = lVar5 + -3;
                        pbVar10 = local_68 + 2;
                        goto LAB_0011688c;
                      }
                      bVar17 = false;
                      local_68 = local_68 + 1;
                    }
                  }
                  lVar5 = lVar6;
                  pbVar11 = pbVar9;
                  local_78 = lVar16;
                } while (bVar17);
                iVar3 = 0;
                local_78 = lVar16;
                if ((lVar6 != 0) && (*pbVar9 != 0x3d)) goto LAB_00116d47;
              }
              goto LAB_00116d6e;
            }
            if (0x1ffff < (long)(local_78 + unaff_R13)) {
              a = self->archive;
              iVar3 = 0x54;
              pcVar12 = "Invalid format data";
              goto LAB_00116d5c;
            }
            if (((long)(unaff_R13 - local_38) < 0xb) ||
               (*(short *)(b + 4) != 0x206e || *(int *)b != 0x69676562)) {
              if ((0x11 < (long)(unaff_R13 - local_38)) &&
                 (*(long *)(b + 5) == 0x203436657361622d && *(long *)b == 0x61622d6e69676562)) {
                lVar5 = 0xd;
                iVar4 = 3;
                goto LAB_00116b45;
              }
              iVar4 = 3;
              bVar17 = true;
              lVar5 = 0;
            }
            else {
              lVar5 = 6;
              iVar4 = 1;
LAB_00116b45:
              bVar17 = false;
            }
            iVar3 = 0;
            if ((((!bVar17) && ((b[lVar5] & 0xf8) == 0x30)) && ((b[lVar5 + 1] & 0xf8) == 0x30)) &&
               (((b[lVar5 + 2] & 0xf8) == 0x30 && (b[lVar5 + 3] == 0x20)))) {
              local_58->state = iVar4;
              local_58->mode =
                   ((uint)b[lVar5] * 0x40 + (uint)b[lVar5 + 1] * 8 + (uint)b[lVar5 + 2]) - 0xdb0;
              local_58->mode_set = 1;
              sVar8 = (unaff_R13 - (local_38 + lVar5)) - 4;
              if (1 < (long)sVar8) {
                local_48 = sVar8;
                if (local_58->name != (char *)0x0) {
                  free(local_58->name);
                }
                pcVar12 = (char *)malloc(local_48 + 1);
                sVar8 = local_48;
                puVar2->name = pcVar12;
                if (pcVar12 == (char *)0x0) {
                  a = self->archive;
                  iVar3 = 0xc;
                  pcVar12 = "Can\'t allocate data for uudecode";
                  goto LAB_00116d5c;
                }
                strncpy(pcVar12,(char *)(b + lVar5 + 4),local_48);
                puVar2->name[sVar8] = '\0';
              }
            }
          }
        }
LAB_00116d6e:
        if (iVar3 != 0) goto LAB_00116da6;
        b = b + unaff_R13;
        sVar15 = sVar15 + unaff_R13;
        sVar14 = unaff_R13;
        if ((long)local_60 <= (long)sVar15) goto LAB_00116e06;
      } while( true );
    }
    sVar15 = 0;
  }
  local_78 = 0;
  goto LAB_00116e06;
LAB_00116da6:
  if (iVar3 - 3U < 2) {
LAB_00116e06:
    lVar5 = 0;
    if ((long)local_50 < (long)local_60) {
      lVar5 = local_50 - local_60;
    }
    __archive_read_filter_consume(self->upstream,lVar5 + sVar15);
    *local_40 = local_58->out_buff;
    local_58->total = local_58->total + local_78;
    return local_78;
  }
  if (iVar3 != 2) {
    return -0x1e;
  }
  b = (byte *)__archive_read_filter_ahead(self->upstream,1,(ssize_t *)&local_60);
  bVar17 = b == (byte *)0x0;
  if ((bVar17) && ((long)local_60 < 0)) {
    return -0x1e;
  }
  goto LAB_001166a3;
}

Assistant:

static ssize_t
uudecode_filter_read(struct archive_read_filter *self, const void **buff)
{
	struct uudecode *uudecode;
	const unsigned char *b, *d;
	unsigned char *out;
	ssize_t avail_in, ravail;
	ssize_t used;
	ssize_t total;
	ssize_t len, llen, nl, namelen;

	uudecode = (struct uudecode *)self->data;

read_more:
	d = __archive_read_filter_ahead(self->upstream, 1, &avail_in);
	if (d == NULL && avail_in < 0)
		return (ARCHIVE_FATAL);
	/* Quiet a code analyzer; make sure avail_in must be zero
	 * when d is NULL. */
	if (d == NULL)
		avail_in = 0;
	used = 0;
	total = 0;
	out = uudecode->out_buff;
	ravail = avail_in;
	if (uudecode->state == ST_IGNORE) {
		used = avail_in;
		goto finish;
	}
	if (uudecode->in_cnt) {
		if (uudecode->in_cnt > UUENCODE_MAX_LINE_LENGTH) {
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Invalid format data");
			return (ARCHIVE_FATAL);
		}
		/*
		 * If there is remaining data which is saved by
		 * previous calling, use it first.
		 */
		if (ensure_in_buff_size(self, uudecode,
		    avail_in + uudecode->in_cnt) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		memcpy(uudecode->in_buff + uudecode->in_cnt,
		    d, avail_in);
		d = uudecode->in_buff;
		avail_in += uudecode->in_cnt;
		uudecode->in_cnt = 0;
	}
	for (;used < avail_in; d += llen, used += llen) {
		ssize_t l, body;

		b = d;
		len = get_line(b, avail_in - used, &nl);
		if (len < 0) {
			/* Non-ascii character is found. */
			if (uudecode->state == ST_FIND_HEAD &&
			    (uudecode->total > 0 || total > 0)) {
				uudecode->state = ST_IGNORE;
				used = avail_in;
				goto finish;
			}
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "Insufficient compressed data");
			return (ARCHIVE_FATAL);
		}
		llen = len;
		if ((nl == 0) && (uudecode->state != ST_UUEND)) {
			if (total == 0 && ravail <= 0) {
				/* There is nothing more to read, fail */
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Missing format data");
				return (ARCHIVE_FATAL);
			}
			/*
			 * Save remaining data which does not contain
			 * NL('\n','\r').
			 */
			if (ensure_in_buff_size(self, uudecode, len)
			    != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			if (uudecode->in_buff != b)
				memmove(uudecode->in_buff, b, len);
			uudecode->in_cnt = len;
			if (total == 0) {
				/* Do not return 0; it means end-of-file.
				 * We should try to read bytes more. */
				__archive_read_filter_consume(
				    self->upstream, ravail);
				goto read_more;
			}
			used += len;
			break;
		}
		switch (uudecode->state) {
		default:
		case ST_FIND_HEAD:
			/* Do not read more than UUENCODE_BID_MAX_READ bytes */
			if (total + len >= UUENCODE_BID_MAX_READ) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Invalid format data");
				return (ARCHIVE_FATAL);
			}
			if (len - nl >= 11 && memcmp(b, "begin ", 6) == 0)
				l = 6;
			else if (len - nl >= 18 &&
			    memcmp(b, "begin-base64 ", 13) == 0)
				l = 13;
			else
				l = 0;
			if (l != 0 && b[l] >= '0' && b[l] <= '7' &&
			    b[l+1] >= '0' && b[l+1] <= '7' &&
			    b[l+2] >= '0' && b[l+2] <= '7' && b[l+3] == ' ') {
				if (l == 6)
					uudecode->state = ST_READ_UU;
				else
					uudecode->state = ST_READ_BASE64;
				uudecode->mode = (mode_t)(
				    ((int)(b[l] - '0') * 64) +
				    ((int)(b[l+1] - '0') * 8) +
				     (int)(b[l+2] - '0'));
				uudecode->mode_set = 1;
				namelen = len - nl - 4 - l;
				if (namelen > 1) {
					if (uudecode->name != NULL)
						free(uudecode->name);
					uudecode->name = malloc(namelen + 1);
			                if (uudecode->name == NULL) {
					archive_set_error(
					    &self->archive->archive,
					    ENOMEM,
					    "Can't allocate data for uudecode");
						return (ARCHIVE_FATAL);
					}
					strncpy(uudecode->name,
					    (const char *)(b + l + 4),
					    namelen);
					uudecode->name[namelen] = '\0';
				}
			}
			break;
		case ST_READ_UU:
			if (total + len * 2 > OUT_BUFF_SIZE)
				goto finish;
			body = len - nl;
			if (!uuchar[*b] || body <= 0) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			/* Get length of undecoded bytes of current line. */
			l = UUDECODE(*b++);
			body--;
			if (l > body) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			if (l == 0) {
				uudecode->state = ST_UUEND;
				break;
			}
			while (l > 0) {
				int n = 0;

				if (!uuchar[b[0]] || !uuchar[b[1]])
					break;
				n = UUDECODE(*b++) << 18;
				n |= UUDECODE(*b++) << 12;
				*out++ = n >> 16; total++;
				--l;

				if (l > 0) {
					if (!uuchar[b[0]])
						break;
					n |= UUDECODE(*b++) << 6;
					*out++ = (n >> 8) & 0xFF; total++;
					--l;
				}
				if (l > 0) {
					if (!uuchar[b[0]])
						break;
					n |= UUDECODE(*b++);
					*out++ = n & 0xFF; total++;
					--l;
				}
			}
			if (l) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			break;
		case ST_UUEND:
			if (len - nl == 3 && memcmp(b, "end ", 3) == 0)
				uudecode->state = ST_FIND_HEAD;
			else {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			break;
		case ST_READ_BASE64:
			if (total + len * 2 > OUT_BUFF_SIZE)
				goto finish;
			l = len - nl;
			if (l >= 3 && b[0] == '=' && b[1] == '=' &&
			    b[2] == '=') {
				uudecode->state = ST_FIND_HEAD;
				break;
			}
			while (l > 0) {
				int n = 0;

				if (!base64[b[0]] || !base64[b[1]])
					break;
				n = base64num[*b++] << 18;
				n |= base64num[*b++] << 12;
				*out++ = n >> 16; total++;
				l -= 2;

				if (l > 0) {
					if (*b == '=')
						break;
					if (!base64[*b])
						break;
					n |= base64num[*b++] << 6;
					*out++ = (n >> 8) & 0xFF; total++;
					--l;
				}
				if (l > 0) {
					if (*b == '=')
						break;
					if (!base64[*b])
						break;
					n |= base64num[*b++];
					*out++ = n & 0xFF; total++;
					--l;
				}
			}
			if (l && *b != '=') {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			break;
		}
	}
finish:
	if (ravail < avail_in)
		used -= avail_in - ravail;
	__archive_read_filter_consume(self->upstream, used);

	*buff = uudecode->out_buff;
	uudecode->total += total;
	return (total);
}